

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O3

expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunkExponents
          (expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  undefined8 uVar1;
  u64 *puVar2;
  long lVar3;
  decode_data *pdVar4;
  __off_t _Var5;
  __off_t _Var6;
  ulong uVar7;
  FILE *pFVar8;
  long lVar9;
  char cVar10;
  byte bVar11;
  unsigned_long *Key;
  char *__format;
  char *pcVar12;
  int iVar13;
  allocator *paVar14;
  undefined8 __off;
  ulong uVar15;
  undefined7 in_register_00000081;
  chunk_exp_cache *Val;
  ulong uVar16;
  undefined7 in_register_00000089;
  _func_int **pp_Var17;
  undefined4 uVar18;
  uint uVar19;
  int iVar20;
  char *__s;
  size_t sVar21;
  uint uVar22;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar23;
  int S;
  int ChunkAddrsSz;
  int NChunks;
  int ExponentSize;
  u64 ChunkAddress;
  file_id FileId;
  iterator FileCacheIt;
  u64 ChunkAddr;
  timer IOTimer;
  timer IOTimer_1;
  file_cache FileCache;
  chunk_exp_cache ChunkExpCache;
  int local_25c;
  decode_data *local_258;
  int local_250;
  uint local_24c;
  expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *local_248;
  idx2_file *local_240;
  undefined4 local_238;
  uint local_234;
  int local_230;
  int local_22c;
  hash_table<unsigned_long,_idx2::chunk_exp_cache> local_228;
  buffer local_1f8;
  anon_union_8_2_2df48d06_for_stref_0 local_1e0 [2];
  undefined1 local_1d0 [16];
  bucket_status *local_1c0;
  long local_1b8;
  long local_1b0;
  buffer local_1a8;
  u64 local_188;
  undefined1 local_180 [16];
  bucket_status *local_170;
  iterator local_168;
  undefined1 local_148 [96];
  hash_table<unsigned_long,_idx2::chunk_exp_cache> local_e8;
  array<int> local_b8;
  undefined8 local_88;
  timespec local_70;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_38;
  
  local_234 = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_238 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_240 = Idx2;
  ConstructFilePath((file_id *)local_1e0,Idx2,Brick,(i8)Key,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_1d0 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_1d0,Key);
  clock_gettime(1,(timespec *)(local_180 + 8));
  local_188 = Brick;
  if ((*(char *)(*(long *)(local_1b8 + 0x10) + local_1b0) == '\x02') &&
     (local_1c0[200] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x10b;
    pcVar12 = "";
    uVar18 = 0;
  }
  else {
    pFVar8 = fopen(local_1e0[0].Ptr,"rb");
    local_228.LogCapacity = (i64)pFVar8;
    if (pFVar8 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x10e;
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == '%') {
          cVar10 = '%';
          goto LAB_00183ed4;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      cVar10 = '\'';
LAB_00183ed4:
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == cVar10) {
          lVar3 = *in_FS_OFFSET;
          iVar13 = snprintf((char *)(lVar3 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)*(uint *)(&action_s::NameMap + lVar9),
                            *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar9),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                            ,0x10e);
          pcVar12 = "File: %s";
          snprintf((char *)(lVar3 + -0xc80) + iVar13,0x400 - (long)iVar13,"File: %s",
                   local_1e0[0].Ptr);
          uVar18 = 0x10025;
          goto LAB_00184148;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      goto LAB_001844c9;
    }
    local_248 = __return_storage_ptr__;
    fseeko(pFVar8,0,2);
    _Var5 = ftello(pFVar8);
    local_22c = 0;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_22c,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    local_24c = 0;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_24c,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_250,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_228.Keys = (unsigned_long *)0x0;
    local_228.Vals = (chunk_exp_cache *)0x0;
    local_228.Stats = (bucket_status *)&Mallocator()::Instance;
    lVar9 = (long)local_250;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    AllocBuf((buffer *)&local_228,lVar9,(allocator *)&Mallocator()::Instance);
    sVar21 = (size_t)local_250;
    if ((long)local_228.Vals < (long)sVar21) {
LAB_001846a8:
      __assert_fail("Sz <= Size(*Buf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                    ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
    }
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 - sVar21,0);
    fread(local_228.Keys,sVar21,1,pFVar8);
    fseeko(pFVar8,_Var6 - sVar21,0);
    LOCK();
    (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
         (D->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar21;
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_1a8.Data = (byte *)0x0;
    local_1a8.Bytes = 0;
    local_1a8.Alloc = (allocator *)&Mallocator()::Instance;
    lVar9 = (long)(int)local_24c;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    AllocBuf(&local_1a8,lVar9 << 3,(allocator *)&Mallocator()::Instance);
    DecompressBufZstd((buffer *)&local_228,&local_1a8);
    local_25c = 0;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    fread(&local_25c,4,1,pFVar8);
    fseeko(pFVar8,_Var6 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_1f8.Data = (byte *)0x0;
    local_1f8.Bytes = 0;
    local_1f8.Alloc = (allocator *)&Mallocator()::Instance;
    lVar9 = (long)local_25c;
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    AllocBuf(&local_1f8,lVar9,(allocator *)&Mallocator()::Instance);
    sVar21 = (size_t)local_25c;
    if (local_1f8.Bytes < (long)sVar21) goto LAB_001846a8;
    _Var6 = ftello(pFVar8);
    fseeko(pFVar8,_Var6 - sVar21,0);
    fread(local_1f8.Data,sVar21,1,pFVar8);
    fseeko(pFVar8,_Var6 - sVar21,0);
    LOCK();
    (D->BytesExps_).super___atomic_base<unsigned_long>._M_i =
         (D->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar21 + 4;
    UNLOCK();
    clock_gettime(1,(timespec *)local_148);
    LOCK();
    (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
         (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
         (long)((double)(long)(local_148._0_8_ - local_180._8_8_) * 1000000000.0 +
               (double)(local_148._8_8_ - (long)local_170));
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    local_228.Alloc = (allocator *)local_1f8.Data;
    pp_Var17 = *(_func_int ***)local_1f8.Data;
    file_cache::file_cache((file_cache *)local_148);
    if (Mallocator()::Instance == '\0') {
      ReadChunkExponents();
    }
    Init<unsigned_long,idx2::chunk_exp_cache>
              ((hash_table<unsigned_long,_idx2::chunk_exp_cache> *)(local_148 + 0x60),10,
               (allocator *)&Mallocator()::Instance);
    iVar13 = local_25c;
    local_88 = _Var5 - local_22c;
    GrowCapacity<int>((array<int> *)(local_148 + 0x90),(long)local_25c);
    uVar7 = 0;
    local_258 = D;
    if (0 < iVar13) {
      uVar22 = 0;
      iVar13 = 0;
      paVar14 = local_228.Alloc;
      do {
        bVar11 = 0;
        lVar9 = 0;
        do {
          if (0x39 < (int)uVar22) {
            pp_Var17 = *(_func_int ***)((long)&paVar14->_vptr_allocator + (ulong)(uVar22 >> 3));
            paVar14 = (allocator *)((long)&paVar14->_vptr_allocator + (ulong)(uVar22 >> 3));
            uVar22 = uVar22 & 7;
          }
          uVar15 = (ulong)pp_Var17 >> ((byte)uVar22 & 0x3f);
          uVar19 = uVar22 + 7;
          if (0x38 < (int)uVar22) {
            pp_Var17 = *(_func_int ***)((long)&paVar14->_vptr_allocator + (ulong)(uVar19 >> 3));
            paVar14 = (allocator *)((long)&paVar14->_vptr_allocator + (ulong)(uVar19 >> 3));
            uVar19 = 0;
          }
          Val = (chunk_exp_cache *)((ulong)pp_Var17 >> ((byte)uVar19 & 0x3f));
          lVar9 = lVar9 + ((uVar15 & bitstream::Masks.Arr[7]) << (bVar11 & 0x3f));
          uVar22 = uVar19 + 1;
          bVar11 = bVar11 + 7;
        } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
        local_230 = iVar13;
        if (local_b8.Capacity <= local_b8.Size) {
          GrowCapacity<int>((array<int> *)(local_148 + 0x90),0);
        }
        iVar13 = local_230 + (int)lVar9;
        uVar1 = local_b8.Size + Tombstone;
        *(int *)(local_b8.Buffer.Data + local_b8.Size * 4) = iVar13;
        local_180._0_8_ = ((allocator *)((long)local_1a8.Data + uVar7 * 8))->_vptr_allocator;
        local_b8.Size = uVar1;
        if (Mallocator()::Instance == '\0') {
          ReadChunkExponents();
        }
        local_70.tv_nsec = 0;
        uStack_60 = 0;
        local_58 = &Mallocator()::Instance;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 0;
        local_38 = 0;
        local_70.tv_sec._0_4_ = (undefined4)uVar7;
        Insert<unsigned_long,idx2::chunk_exp_cache>
                  (&local_168,(idx2 *)(local_148 + 0x60),
                   (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_180,
                   (unsigned_long *)&local_70,Val);
        uVar7 = uVar7 + 1;
        iVar20 = uVar19 + 0xf;
        if (-1 < (int)(uVar19 + 8)) {
          iVar20 = uVar19 + 8;
        }
      } while ((long)paVar14 + ((long)(iVar20 >> 3) - (long)local_228.Alloc) < (long)local_25c);
    }
    uVar22 = local_24c;
    D = local_258;
    if (local_24c != (uint)uVar7) {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x13e;
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == '\x04') {
          cVar10 = '\x04';
          goto LAB_00183f72;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      cVar10 = '\'';
LAB_00183f72:
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == cVar10) {
          lVar3 = *in_FS_OFFSET;
          iVar13 = snprintf((char *)(lVar3 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)*(uint *)(&action_s::NameMap + lVar9),
                            *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar9),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                            ,0x13e);
          lVar9 = (long)iVar13;
          __s = (char *)(lVar3 + -0xc80) + lVar9;
          pcVar12 = "number of chunks is either %d or %d\n";
          __format = "number of chunks is either %d or %d\n";
          uVar15 = (ulong)uVar22;
          uVar16 = uVar7 & 0xffffffff;
          goto LAB_0018410d;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      goto LAB_001844c9;
    }
    if ((long)(int)(uint)uVar7 % (local_240->Subbands).Size != 0) {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x143;
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == '\x04') {
          cVar10 = '\x04';
          goto LAB_0018407f;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      cVar10 = '\'';
LAB_0018407f:
      lVar9 = 0x10;
LAB_00184084:
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) != cVar10)
      goto code_r0x00184089;
      lVar3 = *in_FS_OFFSET;
      iVar13 = snprintf((char *)(lVar3 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)*(uint *)(&action_s::NameMap + lVar9),
                        *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar9),
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                        ,0x143);
      lVar9 = (long)iVar13;
      __s = (char *)(lVar3 + -0xc80) + lVar9;
      uVar16 = (ulong)(uint)(local_240->Subbands).Size;
      pcVar12 = "number of chunks = %d is not divisible by number of subbands which is %d\n";
      __format = "number of chunks = %d is not divisible by number of subbands which is %d\n";
      uVar15 = uVar7 & 0xffffffff;
LAB_0018410d:
      snprintf(__s,0x400 - lVar9,__format,uVar15,uVar16);
      uVar18 = 0x10004;
      D = local_258;
      goto LAB_00184124;
    }
    if (*(char *)(*(long *)(local_1b8 + 0x10) + local_1b0) == '\x02') {
      *(undefined8 *)(local_1c0 + 0xc0) = local_88;
      *(byte **)(local_1c0 + 0x90) = local_b8.Buffer.Data;
      *(i64 *)(local_1c0 + 0x98) = local_b8.Buffer.Bytes;
      *(allocator **)(local_1c0 + 0xa0) = local_b8.Buffer.Alloc;
      *(i64 *)(local_1c0 + 0xa8) = local_b8.Size;
      *(allocator **)(local_1c0 + 0xa0) = local_b8.Buffer.Alloc;
      *(i64 *)(local_1c0 + 0xa8) = local_b8.Size;
      *(i64 *)(local_1c0 + 0xb0) = local_b8.Capacity;
      *(allocator **)(local_1c0 + 0xb8) = local_b8.Alloc;
      *(unsigned_long **)(local_1c0 + 0x60) = local_e8.Keys;
      *(chunk_exp_cache **)(local_1c0 + 0x68) = local_e8.Vals;
      *(bucket_status **)(local_1c0 + 0x70) = local_e8.Stats;
      *(i64 *)(local_1c0 + 0x78) = local_e8.Size;
      *(bucket_status **)(local_1c0 + 0x70) = local_e8.Stats;
      *(i64 *)(local_1c0 + 0x78) = local_e8.Size;
      *(i64 *)(local_1c0 + 0x80) = local_e8.LogCapacity;
      *(allocator **)(local_1c0 + 0x88) = local_e8.Alloc;
    }
    else {
      Insert<unsigned_long,idx2::file_cache>
                ((iterator *)(local_1d0 + 8),(unsigned_long *)local_1d0,(file_cache *)local_148);
    }
    local_1c0[200] = Tombstone;
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x155;
    pcVar12 = "";
    uVar18 = 0;
LAB_00184124:
    __return_storage_ptr__ = local_248;
    DeallocBuf(&local_1f8);
    DeallocBuf(&local_1a8);
    DeallocBuf((buffer *)&local_228);
LAB_00184148:
    if ((FILE *)local_228.LogCapacity != (FILE *)0x0) {
      fclose((FILE *)local_228.LogCapacity);
    }
  }
  if ((char)uVar18 == '\0') {
    if (*(char *)(*(long *)(local_1b8 + 0x10) + local_1b0) != '\x02') {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x17c;
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == '%') {
          cVar10 = '%';
          goto LAB_001844b2;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
      cVar10 = '\'';
LAB_001844b2:
      lVar9 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9) == cVar10) {
          lVar3 = *in_FS_OFFSET;
          iVar13 = snprintf((char *)(lVar3 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)*(uint *)(&action_s::NameMap + lVar9),
                            *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar9),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                            ,0x17c);
          snprintf((char *)(lVar3 + -0xc80) + iVar13,0x400 - (long)iVar13,"File: %s\n",
                   local_1e0[0].Ptr);
          __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001b7c10;
          (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)"File: %s\n";
          (__return_storage_ptr__->field_1).Err.StrGened = true;
          *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
          goto LAB_00184579;
        }
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x3b8);
LAB_001844c9:
      __assert_fail("It != End(EnumS.NameMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                    ,0x38,"stref idx2::ToString(idx2_err_code)");
    }
    if ('\x0f' < (char)local_234) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]")
      ;
    }
    uVar7 = (ulong)(local_240->BricksPerChunk).Arr[(char)local_234];
    lVar9 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    bVar11 = -(uVar7 == 0) | (byte)lVar9;
    local_228.Keys =
         (unsigned_long *)
         ((long)((int)(char)local_238 << 0xc) + ((ulong)(local_234 & 0xff) << 0x3c) +
         (local_188 >> ((1L << (bVar11 & 0x3f) != uVar7) + bVar11 & 0x3f)) * 0x40000);
    Lookup<unsigned_long,idx2::chunk_exp_cache>
              ((iterator *)local_148,(idx2 *)(local_1c0 + 0x60),&local_228,local_228.Keys);
    uVar1 = local_148._8_8_;
    if ((*(bucket_status **)(local_148._16_8_ + 0x10))[local_148._24_8_] == Occupied) {
      if ((((bitstream *)(local_148._8_8_ + 8))->Stream).Bytes == 0) {
        clock_gettime(1,(timespec *)&local_168);
        pFVar8 = fopen(local_1e0[0].Ptr,"rb");
        if (pFVar8 == (FILE *)0x0) {
          local_148._0_8_ = local_1e0;
          eVar23 = ReadChunkExponents::anon_class_8_1_1e916d15::operator()
                             ((anon_class_8_1_1e916d15 *)local_148);
          __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001b7c10;
          (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)eVar23.Msg;
          *(short *)((long)&__return_storage_ptr__->field_1 + 8) = eVar23._8_2_;
          (__return_storage_ptr__->field_1).Err.StrGened = eVar23.StrGened;
          __return_storage_ptr__->Ok = false;
          return __return_storage_ptr__;
        }
        lVar9 = (long)*(i32 *)local_148._8_8_;
        __off = *(undefined8 *)(local_1c0 + 0xc0);
        iVar13 = *(int *)(*(undefined8 *)(local_1c0 + 0x90) + lVar9 * 4);
        if (0 < lVar9) {
          iVar20 = *(int *)((*(undefined8 *)(local_1c0 + 0x90) - 4) + lVar9 * 4);
          __off = __off + (long)iVar20;
          iVar13 = iVar13 - iVar20;
        }
        local_258 = D;
        fseeko(pFVar8,__off,0);
        if (Mallocator()::Instance == '\0') {
          ReadChunkExponents();
        }
        local_148._0_8_ = (file_id *)0x0;
        local_148._8_8_ = (chunk_exp_cache *)0x0;
        local_148._16_8_ = &Mallocator()::Instance;
        sVar21 = (size_t)iVar13;
        if (Mallocator()::Instance == '\0') {
          ReadChunkExponents();
        }
        AllocBuf((buffer *)local_148,sVar21,(allocator *)&Mallocator()::Instance);
        fread((void *)local_148._0_8_,sVar21,1,pFVar8);
        DecompressBufZstd((buffer *)local_148,(bitstream *)(uVar1 + 8));
        pdVar4 = local_258;
        LOCK();
        (local_258->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
             (local_258->BytesDecoded_).super___atomic_base<unsigned_long>._M_i + sVar21;
        UNLOCK();
        LOCK();
        (local_258->BytesExps_).super___atomic_base<unsigned_long>._M_i =
             (local_258->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar21;
        UNLOCK();
        clock_gettime(1,&local_70);
        LOCK();
        (pdVar4->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
             (pdVar4->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
             (long)((double)(CONCAT44(local_70.tv_sec._4_4_,(undefined4)local_70.tv_sec) -
                            (long)local_168.Key) * 1000000000.0 +
                   (double)(local_70.tv_nsec - (long)local_168.Val));
        UNLOCK();
        puVar2 = (u64 *)(((bitstream *)(uVar1 + 8))->Stream).Data;
        ((bitstream *)(uVar1 + 8))->BitBuf = 0;
        ((bitstream *)(uVar1 + 8))->BitPtr = (byte *)puVar2;
        ((bitstream *)(uVar1 + 8))->BitBuf = *puVar2;
        ((bitstream *)(uVar1 + 8))->BitPos = 0;
        DeallocBuf((buffer *)local_148);
        fclose(pFVar8);
      }
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001b7c10;
      (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)uVar1;
      __return_storage_ptr__->Ok = true;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x184;
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001b7c10;
      (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)0x1a9652;
      (__return_storage_ptr__->field_1).Err.StrGened = false;
      *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x23;
      __return_storage_ptr__->Ok = false;
    }
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0xf7c) = 0x17a;
    *(char **)(*in_FS_OFFSET + -0xe78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001b7c10;
    (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)pcVar12;
    (__return_storage_ptr__->field_1).Err.StrGened = SUB41((uint)uVar18 >> 0x10,0);
    *(ushort *)((long)&__return_storage_ptr__->field_1 + 8) = (ushort)uVar18 | 0x100;
LAB_00184579:
    __return_storage_ptr__->Ok = false;
  }
  return __return_storage_ptr__;
code_r0x00184089:
  lVar9 = lVar9 + 0x18;
  if (lVar9 == 0x3b8) goto LAB_001844c9;
  goto LAB_00184084;
}

Assistant:

expected<const chunk_exp_cache*, idx2_err_code>
ReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return ChunkExpCacheIt.Val;

    //read the block
    // TOOD: who manages the memory for buff? (when do I deallocate it?)
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    if (!Result)
      idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    DeallocBuf(&buff);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return ChunkExpCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return ChunkCacheIt.Val;
}